

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  int iVar1;
  TValue *pTVar2;
  StkId o;
  ptrdiff_t func;
  StkId pTStack_30;
  int status;
  CallS c;
  int errfunc_local;
  int nresults_local;
  int nargs_local;
  lua_State *L_local;
  
  c._12_4_ = errfunc;
  if (errfunc == 0) {
    o = (StkId)0x0;
  }
  else {
    pTVar2 = index2adr(L,errfunc);
    o = (StkId)((long)pTVar2 - (long)L->stack);
  }
  pTStack_30 = L->top + -(long)(nargs + 1);
  c.func._0_4_ = nresults;
  iVar1 = luaD_pcall(L,f_call,&stack0xffffffffffffffd0,(long)pTStack_30 - (long)L->stack,
                     (ptrdiff_t)o);
  if ((nresults == -1) && (L->ci->top <= L->top)) {
    L->ci->top = L->top;
  }
  return iVar1;
}

Assistant:

static int lua_pcall(lua_State*L,int nargs,int nresults,int errfunc){
struct CallS c;
int status;
ptrdiff_t func;
api_checknelems(L,nargs+1);
checkresults(L,nargs,nresults);
if(errfunc==0)
func=0;
else{
StkId o=index2adr(L,errfunc);
api_checkvalidindex(L,o);
func=savestack(L,o);
}
c.func=L->top-(nargs+1);
c.nresults=nresults;
status=luaD_pcall(L,f_call,&c,savestack(L,c.func),func);
adjustresults(L,nresults);
return status;
}